

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,false>
          (Thread *this)

{
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar19 [16];
  Value VVar21;
  Value VVar22;
  ulong uVar1;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  
  VVar21 = Pop(this);
  uVar1 = VVar21.field_0._8_8_;
  VVar22 = Pop(this);
  uVar2 = VVar22.field_0._8_8_;
  auVar8._8_6_ = 0;
  auVar8._0_8_ = uVar2;
  auVar8[0xe] = VVar22.field_0._15_1_;
  auVar8[0xf] = VVar22.field_0._15_1_;
  auVar7._14_2_ = auVar8._14_2_;
  auVar7._8_5_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7[0xd] = VVar22.field_0._14_1_;
  auVar6._13_3_ = auVar7._13_3_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6[0xc] = VVar22.field_0._14_1_;
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._8_3_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5[0xb] = VVar22.field_0._13_1_;
  auVar4._11_5_ = auVar5._11_5_;
  auVar4._8_2_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4[10] = VVar22.field_0._13_1_;
  auVar19._10_6_ = auVar4._10_6_;
  auVar19[8] = 0;
  auVar19._0_8_ = uVar2;
  auVar19[9] = VVar22.field_0._12_1_;
  auVar9._9_7_ = auVar19._9_7_;
  auVar9[8] = VVar22.field_0._12_1_;
  auVar9._0_8_ = uVar2;
  auVar3._8_8_ = auVar9._8_8_;
  auVar3[7] = VVar22.field_0._11_1_;
  auVar3[6] = VVar22.field_0._11_1_;
  auVar3[5] = VVar22.field_0._10_1_;
  auVar3[4] = VVar22.field_0._10_1_;
  auVar3[3] = VVar22.field_0._9_1_;
  auVar3[2] = VVar22.field_0._9_1_;
  auVar3[0] = VVar22.field_0._8_1_;
  auVar3[1] = auVar3[0];
  auVar9 = psraw(auVar3,8);
  auVar18._8_6_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[0xe] = VVar21.field_0._15_1_;
  auVar18[0xf] = VVar21.field_0._15_1_;
  auVar17._14_2_ = auVar18._14_2_;
  auVar17._8_5_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[0xd] = VVar21.field_0._14_1_;
  auVar16._13_3_ = auVar17._13_3_;
  auVar16._8_4_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[0xc] = VVar21.field_0._14_1_;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._8_3_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[0xb] = VVar21.field_0._13_1_;
  auVar14._11_5_ = auVar15._11_5_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14[10] = VVar21.field_0._13_1_;
  auVar13._10_6_ = auVar14._10_6_;
  auVar13[8] = 0;
  auVar13._0_8_ = uVar1;
  auVar13[9] = VVar21.field_0._12_1_;
  auVar12._9_7_ = auVar13._9_7_;
  auVar12[8] = VVar21.field_0._12_1_;
  auVar12._0_8_ = uVar1;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11[7] = VVar21.field_0._11_1_;
  auVar11[6] = VVar21.field_0._11_1_;
  auVar11[5] = VVar21.field_0._10_1_;
  auVar11[4] = VVar21.field_0._10_1_;
  auVar11[3] = VVar21.field_0._9_1_;
  auVar11[2] = VVar21.field_0._9_1_;
  auVar11[0] = VVar21.field_0._8_1_;
  auVar11[1] = auVar11[0];
  auVar19 = psraw(auVar11,8);
  auVar10._0_8_ =
       CONCAT26(auVar19._6_2_ * auVar9._6_2_,
                CONCAT24(auVar19._4_2_ * auVar9._4_2_,
                         CONCAT22(auVar19._2_2_ * auVar9._2_2_,auVar19._0_2_ * auVar9._0_2_)));
  auVar10._8_2_ = auVar19._8_2_ * auVar9._8_2_;
  auVar10._10_2_ = auVar19._10_2_ * auVar9._10_2_;
  auVar20._12_2_ = auVar19._12_2_ * auVar9._12_2_;
  auVar20._0_12_ = auVar10;
  auVar20._14_2_ = auVar19._14_2_ * auVar9._14_2_;
  VVar21.field_0._12_4_ = auVar20._12_4_;
  VVar21.field_0._8_4_ = auVar10._8_4_;
  VVar21.field_0.i64_ = auVar10._0_8_;
  Push(this,VVar21);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}